

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

int __thiscall soplex::LPColSetBase<double>::remove(LPColSetBase<double> *this,char *__filename)

{
  double dVar1;
  int iVar2;
  int extraout_EAX;
  double *pdVar3;
  int *piVar4;
  int n;
  VectorBase<double> *in_stack_ffffffffffffff90;
  DataArray<int> *this_00;
  DataArray<int> *this_01;
  undefined4 in_stack_ffffffffffffffc0;
  
  SVSetBase<double>::remove(&this->super_SVSetBase<double>,(char *)((ulong)__filename & 0xffffffff))
  ;
  n = (int)((ulong)&this->low >> 0x20);
  num((LPColSetBase<double> *)0x22fe75);
  pdVar3 = VectorBase<double>::operator[](in_stack_ffffffffffffff90,n);
  this_00 = (DataArray<int> *)*pdVar3;
  pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,n);
  *pdVar3 = (double)this_00;
  num((LPColSetBase<double> *)0x22febe);
  pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,n);
  dVar1 = *pdVar3;
  pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,n);
  *pdVar3 = dVar1;
  num((LPColSetBase<double> *)0x22ff0b);
  pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,n);
  dVar1 = *pdVar3;
  pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,n);
  *pdVar3 = dVar1;
  this_01 = &this->scaleExp;
  iVar2 = num((LPColSetBase<double> *)0x22ff58);
  piVar4 = DataArray<int>::operator[](this_01,iVar2);
  iVar2 = *piVar4;
  piVar4 = DataArray<int>::operator[](&this->scaleExp,(int)__filename);
  *piVar4 = iVar2;
  num((LPColSetBase<double> *)0x22ff9b);
  VectorBase<double>::reDim
            ((VectorBase<double> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
             (int)((ulong)this_01 >> 0x20),SUB81((ulong)this_01 >> 0x18,0));
  num((LPColSetBase<double> *)0x22ffc4);
  VectorBase<double>::reDim
            ((VectorBase<double> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
             (int)((ulong)this_01 >> 0x20),SUB81((ulong)this_01 >> 0x18,0));
  num((LPColSetBase<double> *)0x22ffed);
  VectorBase<double>::reDim
            ((VectorBase<double> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
             (int)((ulong)this_01 >> 0x20),SUB81((ulong)this_01 >> 0x18,0));
  num((LPColSetBase<double> *)0x230016);
  DataArray<int>::reSize(this_00,n);
  return extraout_EAX;
}

Assistant:

void remove(int i)
   {
      SVSetBase<R>::remove(i);
      low[i] = low[num()];
      up[i] = up[num()];
      object[i] = object[num()];
      scaleExp[i] = scaleExp[num()];
      low.reDim(num());
      up.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }